

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

void __thiscall CVmObjFileName::load_image_data(CVmObjFileName *this,char *ptr,size_t siz)

{
  undefined8 uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  CVmVarHeap *pCVar5;
  long lVar6;
  size_t sVar7;
  undefined8 *puVar8;
  long *plVar9;
  char *__s;
  void *in_RSI;
  CVmObjFileName *in_RDI;
  err_frame_t err_cur__;
  char *lcl;
  size_t len;
  char *str;
  int ok;
  char sfbuf [4096];
  vm_filnam_ext *ext;
  int32_t sfid;
  size_t in_stack_ffffffffffffeeb8;
  undefined4 in_stack_ffffffffffffeec0;
  undefined4 in_stack_ffffffffffffeec4;
  undefined8 in_stack_ffffffffffffeec8;
  int32_t iVar10;
  uint local_1128 [2];
  undefined8 local_1120;
  void *local_1118;
  __jmp_buf_tag _Stack_1110;
  char *local_1048;
  undefined4 in_stack_ffffffffffffefd0;
  char cVar11;
  undefined4 in_stack_ffffffffffffefd4;
  char local_1028 [3812];
  int32_t in_stack_fffffffffffffebc;
  size_t in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  vm_filnam_ext *local_28;
  
  iVar10 = (int32_t)((ulong)in_stack_ffffffffffffeec8 >> 0x20);
  if ((in_RDI->super_CVmObject).ext_ != (char *)0x0) {
    pCVar5 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar5->_vptr_CVmVarHeap[6])(pCVar5,(in_RDI->super_CVmObject).ext_);
  }
  lVar6 = osrp4s(in_RSI);
  iVar3 = (int)lVar6;
  if (iVar3 == 0) {
    lVar6 = (long)in_RSI + 4;
    sVar7 = vmb_get_len((char *)0x2e9e9f);
    iVar3 = (int)(sVar7 >> 0x20);
    sVar7 = lVar6 + 2;
    local_1048 = (char *)0x0;
    puVar8 = (undefined8 *)_ZTW11G_err_frame();
    local_1120 = *puVar8;
    plVar9 = (long *)_ZTW11G_err_frame();
    *plVar9 = (long)local_1128;
    local_1128[0] = _setjmp(&_Stack_1110);
    if (local_1128[0] == 0) {
      __s = url_to_local((char *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),sVar7
                         ,iVar3);
      local_1048 = __s;
      strlen(__s);
      local_28 = vm_filnam_ext::alloc_ext
                           (in_RDI,iVar10,
                            (char *)CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                            (size_t)__s);
    }
    if ((local_1128[0] & 0x8000) == 0) {
      local_1128[0] = local_1128[0] | 0x8000;
      lib_free_str((char *)0x2e9f75);
    }
    uVar1 = local_1120;
    puVar8 = (undefined8 *)_ZTW11G_err_frame();
    *puVar8 = uVar1;
    if ((local_1128[0] & 0x4001) != 0) {
      puVar8 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar8 & 2) != 0) {
        plVar9 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar9 + 0x10));
      }
      pvVar2 = local_1118;
      plVar9 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar9 + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_1128[0] & 2) != 0) {
      free(local_1118);
    }
  }
  else {
    iVar4 = CVmObjFile::sfid_to_path
                      (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc
                      );
    cVar11 = (char)iVar4;
    iVar10 = (int32_t)((ulong)local_1028 >> 0x20);
    strlen(local_1028);
    local_28 = vm_filnam_ext::alloc_ext
                         (in_RDI,iVar10,(char *)CONCAT44(iVar3,in_stack_ffffffffffffeec0),
                          in_stack_ffffffffffffeeb8);
    local_28->sfid_valid = cVar11;
  }
  (in_RDI->super_CVmObject).ext_ = (char *)local_28;
  return;
}

Assistant:

void CVmObjFileName::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* get the special file ID */
    int32_t sfid = osrp4s(ptr);

    /* if there's a special file ID, look it up; otherwise load the name */
    vm_filnam_ext *ext;
    if (sfid != 0)
    {
        /* translate the special file ID to a path */
        char sfbuf[OSFNMAX];
        int ok = CVmObjFile::sfid_to_path(vmg_ sfbuf, sizeof(sfbuf), sfid);

        /* allocate the extension */
        ext = vm_filnam_ext::alloc_ext(vmg_ this, sfid, sfbuf, strlen(sfbuf));

        /* note whether the special file ID is valid */
        ext->sfid_valid = (char)ok;
    }
    else
    {
        /* get the filename pointer and length */
        const char *str = ptr + 4;
        size_t len = vmb_get_len(str);
        str += VMB_LEN;

        char *lcl = 0;
        err_try
        {
            /* convert the universal path string to local notation */
            lcl = url_to_local(vmg_ str, len, FALSE);

            /* allocate the extension */
            ext = vm_filnam_ext::alloc_ext(vmg_ this, 0, lcl, strlen(lcl));
        }
        err_finally
        {
            lib_free_str(lcl);
        }